

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::inverseDynamicsInertialParametersRegressor
          (KinDynComputations *this,Vector6 *baseAcc,VectorDynSize *s_ddot,MatrixDynSize *regressor)

{
  long lVar1;
  SpatialAcc *this_00;
  SpatialVector<iDynTree::SpatialMotionVector> *this_01;
  LinkAccArray *other;
  Position *pPVar2;
  MatrixDynSize *in_RCX;
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
  *in_RSI;
  long in_RDI;
  Matrix6x6 B_A_X_A;
  int cols_1;
  Matrix6x6 B_X_A;
  int cols;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff818;
  KinDynComputations *in_stack_fffffffffffff820;
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
  *in_stack_fffffffffffff830;
  VectorDynSize *in_stack_fffffffffffff838;
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
  *in_stack_fffffffffffff840;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff848;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffff858;
  Matrix<double,_6,_1,_0,_6,_1> *in_stack_fffffffffffff898;
  SpatialMotionVector *in_stack_fffffffffffff8a0;
  Transform *in_stack_fffffffffffff8f0;
  Vector6 *in_stack_fffffffffffff8f8;
  Rotation *in_stack_fffffffffffff9a8;
  Twist *in_stack_fffffffffffff9b0;
  Vector6 *in_stack_fffffffffffff9b8;
  Transform local_610 [484];
  undefined4 local_42c;
  undefined4 local_154;
  SpatialAcc local_c8;
  SpatialAcc local_98 [2];
  MatrixDynSize *local_20;
  MatrixBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
  *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  computeFwdKinematics(in_stack_fffffffffffff820);
  if (*(int *)(*(long *)(in_RDI + 8) + 4) == 1) {
    in_stack_fffffffffffff848 =
         (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_> *)
         (*(long *)(in_RDI + 8) + 0x520);
    toEigen<6U>((VectorFixSize<6U> *)in_stack_fffffffffffff838);
    Eigen::Matrix<double,6,1,0,6,1>::
    Matrix<Eigen::Map<Eigen::Matrix<double,6,1,0,6,1>const,0,Eigen::Stride<0,0>>>
              ((Matrix<double,_6,_1,_0,_6,_1> *)in_stack_fffffffffffff820,
               (EigenBase<Eigen::Map<const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffff818);
    fromEigen(in_stack_fffffffffffff8a0,in_stack_fffffffffffff898);
  }
  else if (*(int *)(*(long *)(in_RDI + 8) + 4) == 0) {
    iDynTree::FreeFloatingPos::worldBasePos();
    convertInertialAccelerationToBodyFixedAcceleration
              (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
    iDynTree::SpatialAcc::operator=((SpatialAcc *)(*(long *)(in_RDI + 8) + 0x520),local_98);
    in_stack_fffffffffffff840 = local_10;
  }
  else {
    in_stack_fffffffffffff838 = (VectorDynSize *)iDynTree::FreeFloatingVel::baseVel();
    iDynTree::FreeFloatingPos::worldBasePos();
    iDynTree::Transform::getRotation();
    convertMixedAccelerationToBodyFixedAcceleration
              (in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    iDynTree::SpatialAcc::operator=((SpatialAcc *)(*(long *)(in_RDI + 8) + 0x520),&local_c8);
    in_stack_fffffffffffff830 = local_10;
  }
  lVar1 = *(long *)(in_RDI + 8);
  this_00 = (SpatialAcc *)iDynTree::FreeFloatingAcc::baseAcc();
  iDynTree::SpatialAcc::operator=(this_00,(SpatialAcc *)(lVar1 + 0x520));
  SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3
            ((SpatialVector<iDynTree::SpatialMotionVector> *)(*(long *)(in_RDI + 8) + 0x520));
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff838);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff838);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator-
            (in_stack_fffffffffffff848,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffff840);
  this_01 = (SpatialVector<iDynTree::SpatialMotionVector> *)iDynTree::FreeFloatingAcc::baseAcc();
  SpatialVector<iDynTree::SpatialMotionVector>::getLinearVec3(this_01);
  toEigen<3U>((VectorFixSize<3U> *)in_stack_fffffffffffff838);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffff820,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)in_stack_fffffffffffff818);
  toEigen(in_stack_fffffffffffff838);
  iDynTree::FreeFloatingAcc::jointAcc();
  toEigen(in_stack_fffffffffffff838);
  Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)
             in_stack_fffffffffffff820,in_stack_fffffffffffff818);
  other = (LinkAccArray *)(*(long *)(in_RDI + 8) + 0x5a8);
  iDynTree::ForwardAccKinematics
            ((Model *)(*(long *)(in_RDI + 8) + 8),(Traversal *)(*(long *)(in_RDI + 8) + 0x138),
             (FreeFloatingPos *)(*(long *)(in_RDI + 8) + 0x1b0),
             (FreeFloatingVel *)(*(long *)(in_RDI + 8) + 0x238),
             (FreeFloatingAcc *)(*(long *)(in_RDI + 8) + 0x550),
             (LinkVelArray *)(*(long *)(in_RDI + 8) + 0x310),other);
  iDynTree::InverseDynamicsInertialParametersRegressor
            ((Model *)(*(long *)(in_RDI + 8) + 8),(Traversal *)(*(long *)(in_RDI + 8) + 0x138),
             (LinkPositions *)(*(long *)(in_RDI + 8) + 0x2f8),
             (LinkVelArray *)(*(long *)(in_RDI + 8) + 0x310),
             (LinkAccArray *)(*(long *)(in_RDI + 8) + 0x5a8),local_20);
  if (*(int *)(*(long *)(in_RDI + 8) + 4) == 1) {
    local_154 = iDynTree::MatrixDynSize::cols();
    iDynTree::FreeFloatingPos::worldBasePos();
    iDynTree::Transform::inverse();
    iDynTree::Transform::asAdjointTransformWrench();
    toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffff838);
    toEigen((MatrixDynSize *)in_stack_fffffffffffff848);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
    block<int,int>(in_stack_fffffffffffff858,in_RDI,(Index)in_stack_fffffffffffff848,
                   (int)((ulong)in_stack_fffffffffffff840 >> 0x20),(int)in_stack_fffffffffffff840);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::operator*
              ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffff838,in_stack_fffffffffffff830);
    toEigen((MatrixDynSize *)in_stack_fffffffffffff848);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
    block<int,int>(in_stack_fffffffffffff858,in_RDI,(Index)in_stack_fffffffffffff848,
                   (int)((ulong)in_stack_fffffffffffff840 >> 0x20),(int)in_stack_fffffffffffff840);
    Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>::
    operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>
               *)in_stack_fffffffffffff820,
              (DenseBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>_>
               *)other);
  }
  else if (*(int *)(*(long *)(in_RDI + 8) + 4) != 0) {
    local_42c = iDynTree::MatrixDynSize::cols();
    iDynTree::Rotation::Identity();
    iDynTree::FreeFloatingPos::worldBasePos();
    pPVar2 = (Position *)iDynTree::Transform::getPosition();
    iDynTree::Transform::Transform(local_610,(Rotation *)&stack0xfffffffffffff9a8,pPVar2);
    iDynTree::Transform::inverse();
    iDynTree::Transform::asAdjointTransformWrench();
    toEigen<6u,6u>((MatrixFixSize<6U,_6U> *)in_stack_fffffffffffff838);
    toEigen((MatrixDynSize *)in_stack_fffffffffffff848);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
    block<int,int>(in_stack_fffffffffffff858,in_RDI,(Index)in_stack_fffffffffffff848,
                   (int)((ulong)in_stack_fffffffffffff840 >> 0x20),(int)in_stack_fffffffffffff840);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>>::operator*
              ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffff838,in_stack_fffffffffffff830);
    toEigen((MatrixDynSize *)in_stack_fffffffffffff848);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
    block<int,int>(in_stack_fffffffffffff858,in_RDI,(Index)in_stack_fffffffffffff848,
                   (int)((ulong)in_stack_fffffffffffff840 >> 0x20),(int)in_stack_fffffffffffff840);
    Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>::
    operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>
               *)in_stack_fffffffffffff820,
              (DenseBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>_>
               *)other);
  }
  return true;
}

Assistant:

bool KinDynComputations::inverseDynamicsInertialParametersRegressor(const Vector6& baseAcc,
                                                                    const VectorDynSize& s_ddot,
                                                                          MatrixDynSize& regressor)
{
    // Needed for using pimpl->m_linkVel
    this->computeFwdKinematics();

    // Convert input base acceleration
    if( pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION )
    {
        fromEigen(pimpl->m_invDynBaseAcc,toEigen(baseAcc));
    }
    else if( pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION )
    {
        pimpl->m_invDynBaseAcc = convertInertialAccelerationToBodyFixedAcceleration(baseAcc,pimpl->m_pos.worldBasePos());
    }
    else
    {
        assert(pimpl->m_frameVelRepr == MIXED_REPRESENTATION);
        pimpl->m_invDynBaseAcc = convertMixedAccelerationToBodyFixedAcceleration(baseAcc,
                                                                                 pimpl->m_vel.baseVel(),
                                                                                 pimpl->m_pos.worldBasePos().getRotation());
    }

    // Prepare the vector of generalized proper accs
    pimpl->m_invDynGeneralizedProperAccs.baseAcc() = pimpl->m_invDynBaseAcc;
    toEigen(pimpl->m_invDynGeneralizedProperAccs.baseAcc().getLinearVec3()) =
        toEigen(pimpl->m_invDynBaseAcc.getLinearVec3()) - toEigen(pimpl->m_gravityAccInBaseLinkFrame);
    toEigen(pimpl->m_invDynGeneralizedProperAccs.jointAcc()) = toEigen(s_ddot);

    // Run inverse dynamics
    ForwardAccKinematics(pimpl->m_robot_model,
                         pimpl->m_traversal,
                         pimpl->m_pos,
                         pimpl->m_vel,
                         pimpl->m_invDynGeneralizedProperAccs,
                         pimpl->m_linkVel,
                         pimpl->m_invDynLinkProperAccs);

    // Compute the inverse dynamics regressor, using the absolute frame A as the reference frame in which the base dynamics is expressed
    // (this is done out of convenience because the pimpl->m_linkPos (that contains for each link L the transform A_H_L) is already available
    InverseDynamicsInertialParametersRegressor(pimpl->m_robot_model,
                                               pimpl->m_traversal,
                                               pimpl->m_linkPos,
                                               pimpl->m_linkVel,
                                               pimpl->m_invDynLinkProperAccs,
                                               regressor);

    // Transform the first six rows of the regressor according to the choosen frame velocity representation
    if (pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        int cols = regressor.cols();
        Matrix6x6 B_X_A = pimpl->m_pos.worldBasePos().inverse().asAdjointTransformWrench();
        toEigen(regressor).block(0, 0, 6, cols) =
            toEigen(B_X_A)*toEigen(regressor).block(0, 0, 6, cols);

    }
    else if (pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION)
    {
        // In this case, the first six rows are already with the correct value
    }
    else
    {
        assert(pimpl->m_frameVelRepr == MIXED_REPRESENTATION);
        int cols = regressor.cols();
        Matrix6x6 B_A_X_A = Transform(Rotation::Identity(), pimpl->m_pos.worldBasePos().getPosition()).inverse().asAdjointTransformWrench();
        toEigen(regressor).block(0, 0, 6, cols) =
            toEigen(B_A_X_A)*toEigen(regressor).block(0, 0, 6, cols);
    }

    return true;
}